

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

ostream * smf::Binasc::writeLittleEndianLong(ostream *out,long value)

{
  std::operator<<(out,(char)value);
  std::operator<<(out,(char)((ulong)value >> 8));
  std::operator<<(out,(char)((ulong)value >> 0x10));
  std::operator<<(out,(char)((ulong)value >> 0x18));
  return out;
}

Assistant:

std::ostream& Binasc::writeLittleEndianLong(std::ostream& out, long value) {
	union { char bytes[4]; long l; } data;
	data.l = value;
	out << data.bytes[0];
	out << data.bytes[1];
	out << data.bytes[2];
	out << data.bytes[3];
	return out;
}